

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserManager.cpp
# Opt level: O3

void __thiscall phpconvert::ParserManager::parse(ParserManager *this,AppParams *params)

{
  BaseParser *pBVar1;
  pointer pcVar2;
  string local_68;
  string local_48;
  
  pBVar1 = this->parser;
  pcVar2 = (params->path)._M_dataplus._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + (params->path)._M_string_length);
  BaseParser::setSourceDir(pBVar1,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  BaseParser::setRecursive(this->parser,params->recursive);
  pBVar1 = this->parser;
  pcVar2 = (params->outputPath)._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,pcVar2 + (params->outputPath)._M_string_length);
  BaseParser::setOutputDir(pBVar1,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  (*this->parser->_vptr_BaseParser[2])();
  return;
}

Assistant:

void ParserManager::parse(AppParams *params) {
        getParser()->setSourceDir(params->path);
        getParser()->setRecursive(params->recursive);
        getParser()->setOutputDir(params->outputPath);
        getParser()->parse();
    }